

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

int lws_tls_alloc_pem_to_der_file
              (lws_context *context,char *filename,char *inbuf,lws_filepos_t inlen,uint8_t **buf,
              lws_filepos_t *amount)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  bool bVar4;
  uint8_t *puStack_70;
  int n;
  uint8_t *q;
  lws_filepos_t len;
  uint8_t *opem;
  uint8_t *end;
  uint8_t *p;
  uint8_t *pem;
  lws_filepos_t *amount_local;
  uint8_t **buf_local;
  lws_filepos_t inlen_local;
  char *inbuf_local;
  char *filename_local;
  lws_context *context_local;
  
  p = (uint8_t *)0x0;
  puVar1 = (uint8_t *)inlen;
  puVar2 = (uint8_t *)inbuf;
  pem = (uint8_t *)amount;
  amount_local = (lws_filepos_t *)buf;
  buf_local = (uint8_t **)inlen;
  inlen_local = (lws_filepos_t)inbuf;
  inbuf_local = filename;
  filename_local = context->canonical_hostname;
  if ((filename == (char *)0x0) ||
     (context_local._4_4_ = alloc_file(context,filename,&p,(lws_filepos_t *)&q), puVar1 = q,
     puVar2 = p, context_local._4_4_ == 0)) {
    p = puVar2;
    q = puVar1;
    end = p;
    len = (lws_filepos_t)p;
    opem = p + (long)q;
    iVar3 = strncmp((char *)p,"-----",5);
    if (iVar3 == 0) {
      if ((inbuf_local == (char *)0x0) &&
         (p = (uint8_t *)lws_realloc((void *)0x0,(ulong)((long)buf_local * 3) >> 2,"alloc_der"),
         p == (uint8_t *)0x0)) {
        _lws_log(1,"a\n");
        context_local._4_4_ = 1;
      }
      else {
        end = end + 5;
        while( true ) {
          bVar4 = false;
          if ((end < opem) && (bVar4 = false, *end != '\n')) {
            bVar4 = *end != '-';
          }
          if (!bVar4) break;
          end = end + 1;
        }
        if (*end == '-') {
          while( true ) {
            bVar4 = false;
            if (end < opem) {
              bVar4 = *end != '\n';
            }
            if (!bVar4) break;
            end = end + 1;
          }
          if (end < opem) {
            end = end + 1;
            puStack_70 = opem + -2;
            while( true ) {
              bVar4 = false;
              if (len < puStack_70) {
                bVar4 = *puStack_70 != '\n';
              }
              if (!bVar4) break;
              puStack_70 = puStack_70 + -1;
            }
            if (*puStack_70 == '\n') {
              if (inbuf_local != (char *)0x0) {
                *puStack_70 = '\0';
              }
              iVar3 = lws_b64_decode_string_len
                                ((char *)end,(int)puStack_70 - (int)end,(char *)p,(int)q);
              *(long *)pem = (long)iVar3;
              *amount_local = (lws_filepos_t)p;
              return 0;
            }
            _lws_log(1,"d\n");
          }
          else {
            _lws_log(1,"c\n");
          }
        }
        else {
          _lws_log(1,"b\n");
        }
        lws_realloc(p,0,"lws_free");
        context_local._4_4_ = 4;
      }
    }
    else {
      p = (uint8_t *)lws_realloc((void *)0x0,(size_t)buf_local,"alloc_der");
      if (p == (uint8_t *)0x0) {
        context_local._4_4_ = 1;
      }
      else {
        memcpy(p,(void *)inlen_local,(size_t)buf_local);
        *amount_local = (lws_filepos_t)p;
        *(uint8_t ***)pem = buf_local;
        context_local._4_4_ = 0;
      }
    }
  }
  return context_local._4_4_;
}

Assistant:

int
lws_tls_alloc_pem_to_der_file(struct lws_context *context, const char *filename,
			      const char *inbuf, lws_filepos_t inlen,
			      uint8_t **buf, lws_filepos_t *amount)
{
	uint8_t *pem = NULL, *p, *end, *opem;
	lws_filepos_t len;
	uint8_t *q;
	int n;

	if (filename) {
		n = alloc_file(context, filename, (uint8_t **)&pem, &len);
		if (n)
			return n;
	} else {
		pem = (uint8_t *)inbuf;
		len = inlen;
	}

	opem = p = pem;
	end = p + len;

	if (strncmp((char *)p, "-----", 5)) {

		/* take it as being already DER */

		pem = lws_malloc((size_t)inlen, "alloc_der");
		if (!pem)
			return 1;

		memcpy(pem, inbuf, (size_t)inlen);

		*buf = pem;
		*amount = inlen;

		return 0;
	}

	/* PEM -> DER */

	if (!filename) {
		/* we don't know if it's in const memory... alloc the output */
		pem = lws_malloc(((size_t)inlen * 3) / 4, "alloc_der");
		if (!pem) {
			lwsl_err("a\n");
			return 1;
		}


	} /* else overwrite the allocated, b64 input with decoded DER */

	/* trim the first line */

	p += 5;
	while (p < end && *p != '\n' && *p != '-')
		p++;

	if (*p != '-') {
		lwsl_err("b\n");
		goto bail;
	}

	while (p < end && *p != '\n')
		p++;

	if (p >= end) {
		lwsl_err("c\n");
		goto bail;
	}

	p++;

	/* trim the last line */

	q = (uint8_t *)end - 2;

	while (q > opem && *q != '\n')
		q--;

	if (*q != '\n') {
		lwsl_err("d\n");
		goto bail;
	}

	/* we can't write into the input buffer for mem, since it may be in RO
	 * const segment
	 */
	if (filename)
		*q = '\0';

	*amount = lws_b64_decode_string_len((char *)p, lws_ptr_diff(q, p),
					    (char *)pem, (int)(long long)len);
	*buf = (uint8_t *)pem;

	return 0;

bail:
	lws_free((uint8_t *)pem);

	return 4;
}